

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

bool comparesEqual(QJsonObject *lhs,QJsonObject *rhs)

{
  QCborContainerPrivate *pQVar1;
  QCborContainerPrivate *pQVar2;
  long lVar3;
  bool bVar4;
  long idx;
  long in_FS_OFFSET;
  bool bVar5;
  QCborValue local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (rhs->o).d.ptr;
  pQVar2 = (lhs->o).d.ptr;
  bVar4 = true;
  if (pQVar2 != pQVar1) {
    if (pQVar2 == (QCborContainerPrivate *)0x0) {
      lVar3 = (pQVar1->elements).d.size;
    }
    else {
      lVar3 = (pQVar2->elements).d.size;
      if (pQVar1 != (QCborContainerPrivate *)0x0) {
        if (lVar3 == (pQVar1->elements).d.size) {
          if (lVar3 != 0) {
            idx = 0;
            do {
              QCborContainerPrivate::valueAt(&local_50,(lhs->o).d.ptr,idx);
              QCborContainerPrivate::valueAt(&local_68,(rhs->o).d.ptr,idx);
              bVar4 = comparesEqual(&local_50,&local_68);
              QCborValue::~QCborValue((QCborValue *)&local_68);
              QCborValue::~QCborValue((QCborValue *)&local_50);
              if (!bVar4) break;
              bVar5 = lVar3 + -1 != idx;
              idx = idx + 1;
            } while (bVar5);
          }
        }
        else {
          bVar4 = false;
        }
        goto LAB_002f074a;
      }
    }
    bVar4 = lVar3 == 0;
  }
LAB_002f074a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool comparesEqual(const QJsonObject &lhs, const QJsonObject &rhs)
{
    if (lhs.o == rhs.o)
        return true;

    if (!lhs.o)
        return !rhs.o->elements.size();
    if (!rhs.o)
        return !lhs.o->elements.size();
    if (lhs.o->elements.size() != rhs.o->elements.size())
        return false;

    for (qsizetype i = 0, end = lhs.o->elements.size(); i < end; ++i) {
        if (lhs.o->valueAt(i) != rhs.o->valueAt(i))
            return false;
    }

    return true;
}